

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall duckdb::DBConfig::SetDefaultMaxMemory(DBConfig *this)

{
  type fs;
  idx_t iVar1;
  DBConfigOptions DStack_508;
  
  fs = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator*
                 (&this->file_system);
  iVar1 = GetSystemAvailableMemory(fs);
  switchD_01043a80::default(&DStack_508,0,0x4e8);
  DBConfigOptions::DBConfigOptions(&DStack_508);
  DBConfigOptions::~DBConfigOptions(&DStack_508);
  if (iVar1 != DStack_508.maximum_memory) {
    iVar1 = (iVar1 << 3) / 10;
  }
  (this->options).maximum_memory = iVar1;
  return;
}

Assistant:

void DBConfig::SetDefaultMaxMemory() {
	auto memory = GetSystemAvailableMemory(*file_system);
	if (memory == DBConfigOptions().maximum_memory) {
		// If GetSystemAvailableMemory returned the default, use it as is
		options.maximum_memory = memory;
	} else {
		// Otherwise, use 80% of the available memory
		options.maximum_memory = memory * 8 / 10;
	}
}